

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WindowCodeStep(Parse *pParse,Select *p,WhereInfo *pWInfo,int regGosub,int addrGosub)

{
  u8 uVar1;
  short sVar2;
  uint p1;
  int iVar3;
  int iVar4;
  Window *pWVar5;
  ExprList *pEVar6;
  FuncDef *pFVar7;
  char *pcVar8;
  uint p1_00;
  int iVar9;
  int iVar10;
  Vdbe *p_00;
  Vdbe *p_01;
  int iVar11;
  Op *pOVar12;
  int iVar13;
  Window *pWVar14;
  int p1_01;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  WindowCodeArg s;
  int local_d4;
  int local_b8;
  int local_ac;
  WindowCodeArg local_98;
  KeyInfo *local_50;
  uint local_44;
  ExprList *local_40;
  WhereInfo *local_38;
  
  pWVar5 = p->pWin;
  local_40 = pWVar5->pOrderBy;
  local_38 = pWInfo;
  p_00 = sqlite3GetVdbe(pParse);
  iVar18 = p->pSrc->a[0].iCursor;
  sVar2 = (p->pSrc->a[0].pTab)->nCol;
  iVar17 = (int)sVar2;
  iVar11 = pParse->nLabel + -1;
  pParse->nLabel = iVar11;
  local_98.regArg = 0;
  local_98.eDelete = 0;
  local_98.addrGosub = addrGosub;
  local_98.regGosub = regGosub;
  p1 = pWVar5->iEphCsr;
  local_98.current.reg = 0;
  local_98.current.csr = p1;
  local_44 = p1 + 2;
  local_98.start.reg = 0;
  local_98.start.csr = local_44;
  p1_00 = p1 + 3;
  local_98.end.reg = 0;
  local_98.end.csr = p1_00;
  local_98.pParse = pParse;
  local_98.pMWin = pWVar5;
  local_98.pVdbe = p_00;
  if (pWVar5->eStart == 'W') {
    pWVar14 = pWVar5;
    if (pWVar5->regStartRowid == 0) {
      for (; pWVar14 != (Window *)0x0; pWVar14 = pWVar14->pNextWin) {
        pcVar8 = pWVar14->pFunc->zName;
        if ((((pcVar8 == "lag") || (pcVar8 == "lead")) || (pcVar8 == "nth_value")) ||
           (pcVar8 == "first_value")) goto LAB_0017b1ef;
      }
      iVar10 = 1;
      if (pWVar5->eEnd != 'U') goto LAB_0017b1eb;
      if (pWVar5->eFrmType != 'V') {
        iVar9 = windowExprGtZero(pParse,pWVar5->pEnd);
        iVar10 = 3;
        goto LAB_0017b16d;
      }
    }
  }
  else {
    iVar10 = 2;
    if (pWVar5->eStart == 'S') {
      if (pWVar5->eFrmType != 'V') {
        iVar9 = windowExprGtZero(pParse,pWVar5->pStart);
        iVar10 = 1;
LAB_0017b16d:
        if (iVar9 != 0) goto LAB_0017b1eb;
      }
    }
    else {
LAB_0017b1eb:
      local_98.eDelete = iVar10;
    }
  }
LAB_0017b1ef:
  iVar10 = pParse->nMem;
  iVar9 = iVar10 + iVar17 + 2;
  pParse->nMem = iVar9;
  if ((pWVar5->eStart == 'U') || (iVar13 = 0, pWVar5->eStart == 'S')) {
    iVar13 = iVar10 + iVar17 + 3;
    pParse->nMem = iVar13;
  }
  if ((pWVar5->eEnd == 'U') || (local_d4 = 0, pWVar5->eEnd == 'S')) {
    local_d4 = pParse->nMem + 1;
    pParse->nMem = local_d4;
  }
  iVar15 = iVar10 + 1;
  local_ac = 0;
  p1_01 = 0;
  if (pWVar5->eFrmType != 'L') {
    if (local_40 == (ExprList *)0x0) {
      iVar16 = 0;
    }
    else {
      iVar16 = local_40->nExpr;
    }
    p1_01 = pWVar5->nBufferCol + iVar15;
    if (pWVar5->pPartition != (ExprList *)0x0) {
      p1_01 = p1_01 + pWVar5->pPartition->nExpr;
    }
    iVar3 = pParse->nMem;
    local_ac = iVar3 + 1;
    iVar4 = iVar3 + iVar16;
    pParse->nMem = iVar4;
    local_98.start.reg = iVar3 + 1 + iVar16;
    iVar3 = iVar4 + iVar16;
    pParse->nMem = iVar3;
    local_98.current.reg = iVar16 + 1 + iVar4;
    pParse->nMem = iVar3 + iVar16;
    local_98.end.reg = iVar3 + iVar16 + 1;
    pParse->nMem = iVar3 + iVar16 + iVar16;
  }
  iVar10 = iVar10 + iVar17 + 1;
  if (0 < sVar2) {
    iVar16 = 0;
    do {
      sqlite3VdbeAddOp3(p_00,0x5a,iVar18,iVar16,iVar15 + iVar16);
      iVar16 = iVar16 + 1;
    } while (iVar17 != iVar16);
  }
  iVar16 = p1 + 1;
  sqlite3VdbeAddOp3(p_00,0x5c,iVar15,iVar17,iVar10);
  pEVar6 = pWVar5->pPartition;
  iVar18 = 0;
  local_b8 = 0;
  iVar17 = 0;
  if (pEVar6 != (ExprList *)0x0) {
    iVar4 = pEVar6->nExpr;
    iVar15 = iVar15 + pWVar5->nBufferCol;
    local_50 = sqlite3KeyInfoFromExprList(pParse,pEVar6,0,0);
    local_b8 = pParse->nMem + 1;
    pParse->nMem = local_b8;
    iVar17 = sqlite3VdbeAddOp3(p_00,0x57,iVar15,pWVar5->regPart,iVar4);
    if (p_00->db->mallocFailed == '\0') {
      pOVar12 = p_00->aOp;
      iVar3 = p_00->nOp;
      pOVar12[(long)iVar3 + -1].p4type = -9;
      pOVar12[(long)iVar3 + -1].p4.pKeyInfo = local_50;
    }
    else {
      freeP4(p_00->db,-9,local_50);
    }
    sqlite3VdbeAddOp3(p_00,0x10,iVar17 + 2,iVar17 + 4,iVar17 + 2);
    iVar17 = sqlite3VdbeAddOp3(p_00,0xc,local_b8,0,0);
    sqlite3VdbeAddOp3(p_00,0x4e,iVar15,pWVar5->regPart,iVar4 + -1);
  }
  local_50 = (KeyInfo *)CONCAT44(local_50._4_4_,iVar17);
  sqlite3VdbeAddOp3(p_00,0x79,iVar16,iVar9,0);
  sqlite3VdbeAddOp3(p_00,0x7a,iVar16,iVar10,iVar9);
  iVar17 = sqlite3VdbeAddOp3(p_00,0x34,pWVar5->regOne,0,iVar9);
  p_01 = sqlite3GetVdbe(pParse);
  if (pWVar5 != (Window *)0x0) {
    pWVar14 = pWVar5;
    iVar10 = 0;
    do {
      pFVar7 = pWVar14->pFunc;
      sqlite3VdbeAddOp3(p_01,0x49,0,pWVar14->regAccum,0);
      pEVar6 = (pWVar14->pOwner->x).pList;
      iVar9 = 0;
      if (pEVar6 != (ExprList *)0x0) {
        iVar9 = pEVar6->nExpr;
      }
      iVar18 = 0;
      if (iVar9 < iVar10) {
        iVar18 = iVar10;
      }
      if ((pEVar6 != (ExprList *)0x0) && (iVar10 <= iVar9)) {
        iVar18 = pEVar6->nExpr;
      }
      if (pWVar5->regStartRowid == 0) {
        pcVar8 = pFVar7->zName;
        if (pcVar8 == "nth_value" || pcVar8 == "first_value") {
          sqlite3VdbeAddOp3(p_01,0x46,0,pWVar14->regApp,0);
          sqlite3VdbeAddOp3(p_01,0x46,0,pWVar14->regApp + 1,0);
        }
        if (((pFVar7->funcFlags & 0x1000) != 0) && (pWVar14->csrApp != 0)) {
          sqlite3VdbeAddOp3(p_01,0x8a,pWVar14->csrApp,0,0);
          sqlite3VdbeAddOp3(p_01,0x46,0,pWVar14->regApp + 1,0);
        }
      }
      pWVar14 = pWVar14->pNextWin;
      iVar10 = iVar18;
    } while (pWVar14 != (Window *)0x0);
  }
  iVar10 = pParse->nMem;
  pParse->nMem = iVar18 + iVar10;
  local_98.regArg = iVar10 + 1;
  if (iVar13 != 0) {
    sqlite3ExprCode(pParse,pWVar5->pStart,iVar13);
    windowCheckValue(pParse,iVar13,(uint)(pWVar5->eFrmType == 'V') * 3);
  }
  if (local_d4 != 0) {
    sqlite3ExprCode(pParse,pWVar5->pEnd,local_d4);
    windowCheckValue(pParse,local_d4,(uint)(pWVar5->eFrmType == 'V') * 3 + 1);
  }
  if ((iVar13 != 0) && (pWVar5->eStart == pWVar5->eEnd)) {
    iVar18 = sqlite3VdbeAddOp3(p_00,(uint)(pWVar5->eStart == 'S') * 2 + 0x37,iVar13,0,local_d4);
    windowAggFinal(&local_98,0);
    sqlite3VdbeAddOp3(p_00,0x24,p1,1,0);
    windowReturnOneRow(&local_98);
    sqlite3VdbeAddOp3(p_00,0x8a,p1,0,0);
    sqlite3VdbeAddOp3(p_00,0xb,0,iVar11,0);
    if (p_00->db->mallocFailed == '\0') {
      iVar10 = p_00->nOp + -1;
      if (-1 < iVar18) {
        iVar10 = iVar18;
      }
      pOVar12 = p_00->aOp + iVar10;
    }
    else {
      pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar12->p2 = p_00->nOp;
  }
  if (((pWVar5->eStart == 'S') && (local_d4 != 0)) && (pWVar5->eFrmType != 'V')) {
    sqlite3VdbeAddOp3(p_00,0x65,iVar13,local_d4,iVar13);
  }
  pEVar6 = local_40;
  if (pWVar5->eStart != 'W') {
    sqlite3VdbeAddOp3(p_00,0x24,local_44,1,0);
  }
  sqlite3VdbeAddOp3(p_00,0x24,p1,1,0);
  sqlite3VdbeAddOp3(p_00,0x24,p1_00,1,0);
  if (pEVar6 != (ExprList *)0x0 && local_ac != 0) {
    sqlite3VdbeAddOp3(p_00,0x4e,p1_01,local_ac,pEVar6->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x4e,local_ac,local_98.start.reg,pEVar6->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x4e,local_ac,local_98.current.reg,pEVar6->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x4e,local_ac,local_98.end.reg,pEVar6->nExpr + -1);
  }
  sqlite3VdbeAddOp3(p_00,0xb,0,iVar11,0);
  if (p_00->db->mallocFailed == '\0') {
    iVar18 = p_00->nOp + -1;
    if (-1 < iVar17) {
      iVar18 = iVar17;
    }
    pOVar12 = p_00->aOp + iVar18;
  }
  else {
    pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar12->p2 = p_00->nOp;
  if (local_ac != 0) {
    windowIfNewPeer(pParse,pEVar6,p1_01,local_ac,iVar11);
  }
  if (pWVar5->eStart == 'S') {
    windowCodeOp(&local_98,3,0,0);
    if (pWVar5->eEnd != 'W') {
      iVar18 = local_d4;
      if (pWVar5->eFrmType != 'V') {
LAB_0017b9f8:
        windowCodeOp(&local_98,1,iVar18,0);
        iVar17 = 2;
        iVar18 = iVar13;
        goto LAB_0017ba0a;
      }
      iVar17 = pParse->nLabel + -1;
      pParse->nLabel = iVar17;
      iVar18 = p_00->nOp;
      windowCodeRangeTest(&local_98,0x39,p1,local_d4,p1_00,iVar17);
      windowCodeOp(&local_98,2,iVar13,0);
      windowCodeOp(&local_98,1,0,0);
LAB_0017ba84:
      sqlite3VdbeAddOp3(p_00,0xb,0,iVar18,0);
      sqlite3VdbeResolveLabel(p_00,iVar17);
    }
  }
  else {
    if (pWVar5->eEnd != 'U') {
      windowCodeOp(&local_98,3,0,0);
      if (pWVar5->eEnd != 'W') {
        if (pWVar5->eFrmType == 'V') {
          iVar18 = p_00->nOp;
          if (local_d4 == 0) {
            iVar17 = 0;
          }
          else {
            iVar17 = pParse->nLabel + -1;
            pParse->nLabel = iVar17;
            windowCodeRangeTest(&local_98,0x39,p1,local_d4,p1_00,iVar17);
          }
          windowCodeOp(&local_98,1,0,0);
          windowCodeOp(&local_98,2,iVar13,0);
          if (local_d4 != 0) goto LAB_0017ba84;
        }
        else {
          if (local_d4 == 0) {
            iVar18 = 0;
          }
          else {
            iVar18 = sqlite3VdbeAddOp3(p_00,0x2f,local_d4,0,1);
          }
          windowCodeOp(&local_98,1,0,0);
          windowCodeOp(&local_98,2,iVar13,0);
          if (local_d4 != 0) {
            if (p_00->db->mallocFailed == '\0') {
              iVar17 = p_00->nOp + -1;
              if (-1 < iVar18) {
                iVar17 = iVar18;
              }
              pOVar12 = p_00->aOp + iVar17;
            }
            else {
              pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar12->p2 = p_00->nOp;
          }
        }
      }
      goto LAB_0017ba97;
    }
    if (pWVar5->eStart != 'U') {
      windowCodeOp(&local_98,3,local_d4,0);
LAB_0017b9e9:
      iVar18 = 0;
      goto LAB_0017b9f8;
    }
    uVar1 = pWVar5->eFrmType;
    windowCodeOp(&local_98,3,local_d4,0);
    if (uVar1 != 'V') goto LAB_0017b9e9;
    windowCodeOp(&local_98,2,iVar13,0);
    iVar17 = 1;
    iVar18 = 0;
LAB_0017ba0a:
    windowCodeOp(&local_98,iVar17,iVar18,0);
  }
LAB_0017ba97:
  sqlite3VdbeResolveLabel(p_00,iVar11);
  sqlite3WhereEnd(local_38);
  if (pWVar5->pPartition == (ExprList *)0x0) {
    iVar18 = 0;
  }
  else {
    iVar18 = sqlite3VdbeAddOp3(p_00,0x46,0,local_b8,0);
    if (p_00->db->mallocFailed == '\0') {
      iVar11 = p_00->nOp + -1;
      if (-1 < (int)local_50) {
        iVar11 = (int)local_50;
      }
      pOVar12 = p_00->aOp + iVar11;
    }
    else {
      pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar12->p2 = p_00->nOp;
  }
  iVar11 = sqlite3VdbeAddOp3(p_00,0x24,iVar16,0,0);
  uVar1 = pWVar5->eStart;
  if (pWVar5->eEnd != 'U') {
    windowCodeOp(&local_98,3,0,0);
    if (uVar1 == 'S') {
      if (pWVar5->eFrmType == 'V') {
        iVar17 = p_00->nOp;
        iVar9 = windowCodeOp(&local_98,2,iVar13,1);
        iVar10 = windowCodeOp(&local_98,1,0,1);
      }
      else {
        iVar17 = p_00->nOp;
        if (pWVar5->eEnd == 'W') {
          iVar10 = windowCodeOp(&local_98,1,iVar13,1);
          iVar13 = 0;
        }
        else {
          iVar10 = windowCodeOp(&local_98,1,local_d4,1);
        }
        iVar9 = windowCodeOp(&local_98,2,iVar13,1);
      }
      sqlite3VdbeAddOp3(p_00,0xb,0,iVar17,0);
      iVar17 = p_00->nOp;
      if (p_00->db->mallocFailed == '\0') {
        iVar13 = iVar17 + -1;
        if (-1 < iVar9) {
          iVar13 = iVar9;
        }
        pOVar12 = p_00->aOp + iVar13;
      }
      else {
        pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar12->p2 = iVar17;
      iVar9 = windowCodeOp(&local_98,1,0,1);
      sqlite3VdbeAddOp3(p_00,0xb,0,iVar17,0);
      iVar17 = p_00->nOp;
      if (p_00->db->mallocFailed == '\0') {
        if (iVar10 < 0) {
          iVar10 = iVar17 + -1;
        }
        p_00->aOp[iVar10].p2 = iVar17;
        if (iVar9 < 0) {
          iVar9 = iVar17 + -1;
        }
        pOVar12 = p_00->aOp + iVar9;
      }
      else {
        pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
        DAT_00210a80 = iVar17;
      }
      pOVar12->p2 = iVar17;
    }
    else {
      iVar17 = p_00->nOp;
      iVar10 = windowCodeOp(&local_98,1,0,1);
      windowCodeOp(&local_98,2,iVar13,0);
      sqlite3VdbeAddOp3(p_00,0xb,0,iVar17,0);
      if (p_00->db->mallocFailed == '\0') {
        iVar17 = p_00->nOp + -1;
        if (-1 < iVar10) {
          iVar17 = iVar10;
        }
        pOVar12 = p_00->aOp + iVar17;
      }
      else {
        pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar12->p2 = p_00->nOp;
    }
    goto LAB_0017bdf3;
  }
  if (uVar1 == 'U') {
    uVar1 = pWVar5->eFrmType;
    windowCodeOp(&local_98,3,local_d4,0);
    if (uVar1 == 'V') {
      iVar17 = 2;
      local_d4 = iVar13;
      goto LAB_0017bbf9;
    }
  }
  else {
    iVar17 = 3;
LAB_0017bbf9:
    windowCodeOp(&local_98,iVar17,local_d4,0);
  }
  windowCodeOp(&local_98,1,0,0);
LAB_0017bdf3:
  if (p_00->db->mallocFailed == '\0') {
    iVar17 = p_00->nOp + -1;
    if (-1 < iVar11) {
      iVar17 = iVar11;
    }
    pOVar12 = p_00->aOp + iVar17;
  }
  else {
    pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar12->p2 = p_00->nOp;
  sqlite3VdbeAddOp3(p_00,0x8a,local_98.current.csr,0,0);
  if (pWVar5->pPartition == (ExprList *)0x0) {
    return;
  }
  if (pWVar5->regStartRowid != 0) {
    sqlite3VdbeAddOp3(p_00,0x46,1,pWVar5->regStartRowid,0);
    sqlite3VdbeAddOp3(p_00,0x46,0,pWVar5->regEndRowid,0);
  }
  if (p_00->db->mallocFailed == '\0') {
    iVar11 = p_00->nOp + -1;
    if (-1 < iVar18) {
      iVar11 = iVar18;
    }
    pOVar12 = p_00->aOp + iVar11;
  }
  else {
    pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar12->p1 = p_00->nOp;
  sqlite3VdbeAddOp3(p_00,0x42,local_b8,0,0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowCodeStep(
  Parse *pParse,                  /* Parse context */
  Select *p,                      /* Rewritten SELECT statement */
  WhereInfo *pWInfo,              /* Context returned by sqlite3WhereBegin() */
  int regGosub,                   /* Register for OP_Gosub */
  int addrGosub                   /* OP_Gosub here to return each row */
){
  Window *pMWin = p->pWin;
  ExprList *pOrderBy = pMWin->pOrderBy;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int csrWrite;                   /* Cursor used to write to eph. table */
  int csrInput = p->pSrc->a[0].iCursor;     /* Cursor of sub-select */
  int nInput = p->pSrc->a[0].pTab->nCol;    /* Number of cols returned by sub */
  int iInput;                               /* To iterate through sub cols */
  int addrNe;                     /* Address of OP_Ne */
  int addrGosubFlush = 0;         /* Address of OP_Gosub to flush: */
  int addrInteger = 0;            /* Address of OP_Integer */
  int addrEmpty;                  /* Address of OP_Rewind in flush: */
  int regStart = 0;               /* Value of <expr> PRECEDING */
  int regEnd = 0;                 /* Value of <expr> FOLLOWING */
  int regNew;                     /* Array of registers holding new input row */
  int regRecord;                  /* regNew array in record form */
  int regRowid;                   /* Rowid for regRecord in eph table */
  int regNewPeer = 0;             /* Peer values for new row (part of regNew) */
  int regPeer = 0;                /* Peer values for current row */
  int regFlushPart = 0;           /* Register for "Gosub flush_partition" */
  WindowCodeArg s;                /* Context object for sub-routines */
  int lblWhereEnd;                /* Label just before sqlite3WhereEnd() code */

  assert( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_CURRENT 
       || pMWin->eStart==TK_FOLLOWING || pMWin->eStart==TK_UNBOUNDED 
  );
  assert( pMWin->eEnd==TK_FOLLOWING || pMWin->eEnd==TK_CURRENT 
       || pMWin->eEnd==TK_UNBOUNDED || pMWin->eEnd==TK_PRECEDING 
  );
  assert( pMWin->eExclude==0 || pMWin->eExclude==TK_CURRENT
       || pMWin->eExclude==TK_GROUP || pMWin->eExclude==TK_TIES
       || pMWin->eExclude==TK_NO
  );

  lblWhereEnd = sqlite3VdbeMakeLabel(pParse);

  /* Fill in the context object */
  memset(&s, 0, sizeof(WindowCodeArg));
  s.pParse = pParse;
  s.pMWin = pMWin;
  s.pVdbe = v;
  s.regGosub = regGosub;
  s.addrGosub = addrGosub;
  s.current.csr = pMWin->iEphCsr;
  csrWrite = s.current.csr+1;
  s.start.csr = s.current.csr+2;
  s.end.csr = s.current.csr+3;

  /* Figure out when rows may be deleted from the ephemeral table. There
  ** are four options - they may never be deleted (eDelete==0), they may 
  ** be deleted as soon as they are no longer part of the window frame
  ** (eDelete==WINDOW_AGGINVERSE), they may be deleted as after the row 
  ** has been returned to the caller (WINDOW_RETURN_ROW), or they may
  ** be deleted after they enter the frame (WINDOW_AGGSTEP). */
  switch( pMWin->eStart ){
    case TK_FOLLOWING:
      if( pMWin->eFrmType!=TK_RANGE
       && windowExprGtZero(pParse, pMWin->pStart)
      ){
        s.eDelete = WINDOW_RETURN_ROW;
      }
      break;
    case TK_UNBOUNDED:
      if( windowCacheFrame(pMWin)==0 ){
        if( pMWin->eEnd==TK_PRECEDING ){
          if( pMWin->eFrmType!=TK_RANGE
           && windowExprGtZero(pParse, pMWin->pEnd)
          ){
            s.eDelete = WINDOW_AGGSTEP;
          }
        }else{
          s.eDelete = WINDOW_RETURN_ROW;
        }
      }
      break;
    default:
      s.eDelete = WINDOW_AGGINVERSE;
      break;
  }

  /* Allocate registers for the array of values from the sub-query, the
  ** samve values in record form, and the rowid used to insert said record
  ** into the ephemeral table.  */
  regNew = pParse->nMem+1;
  pParse->nMem += nInput;
  regRecord = ++pParse->nMem;
  regRowid = ++pParse->nMem;

  /* If the window frame contains an "<expr> PRECEDING" or "<expr> FOLLOWING"
  ** clause, allocate registers to store the results of evaluating each
  ** <expr>.  */
  if( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_FOLLOWING ){
    regStart = ++pParse->nMem;
  }
  if( pMWin->eEnd==TK_PRECEDING || pMWin->eEnd==TK_FOLLOWING ){
    regEnd = ++pParse->nMem;
  }

  /* If this is not a "ROWS BETWEEN ..." frame, then allocate arrays of
  ** registers to store copies of the ORDER BY expressions (peer values) 
  ** for the main loop, and for each cursor (start, current and end). */
  if( pMWin->eFrmType!=TK_ROWS ){
    int nPeer = (pOrderBy ? pOrderBy->nExpr : 0);
    regNewPeer = regNew + pMWin->nBufferCol;
    if( pMWin->pPartition ) regNewPeer += pMWin->pPartition->nExpr;
    regPeer = pParse->nMem+1;       pParse->nMem += nPeer;
    s.start.reg = pParse->nMem+1;   pParse->nMem += nPeer;
    s.current.reg = pParse->nMem+1; pParse->nMem += nPeer;
    s.end.reg = pParse->nMem+1;     pParse->nMem += nPeer;
  }

  /* Load the column values for the row returned by the sub-select
  ** into an array of registers starting at regNew. Assemble them into
  ** a record in register regRecord. */
  for(iInput=0; iInput<nInput; iInput++){
    sqlite3VdbeAddOp3(v, OP_Column, csrInput, iInput, regNew+iInput);
  }
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regNew, nInput, regRecord);

  /* An input row has just been read into an array of registers starting
  ** at regNew. If the window has a PARTITION clause, this block generates 
  ** VM code to check if the input row is the start of a new partition.
  ** If so, it does an OP_Gosub to an address to be filled in later. The
  ** address of the OP_Gosub is stored in local variable addrGosubFlush. */
  if( pMWin->pPartition ){
    int addr;
    ExprList *pPart = pMWin->pPartition;
    int nPart = pPart->nExpr;
    int regNewPart = regNew + pMWin->nBufferCol;
    KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pPart, 0, 0);

    regFlushPart = ++pParse->nMem;
    addr = sqlite3VdbeAddOp3(v, OP_Compare, regNewPart, pMWin->regPart, nPart);
    sqlite3VdbeAppendP4(v, (void*)pKeyInfo, P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump, addr+2, addr+4, addr+2);
    VdbeCoverageEqNe(v);
    addrGosubFlush = sqlite3VdbeAddOp1(v, OP_Gosub, regFlushPart);
    VdbeComment((v, "call flush_partition"));
    sqlite3VdbeAddOp3(v, OP_Copy, regNewPart, pMWin->regPart, nPart-1);
  }

  /* Insert the new row into the ephemeral table */
  sqlite3VdbeAddOp2(v, OP_NewRowid, csrWrite, regRowid);
  sqlite3VdbeAddOp3(v, OP_Insert, csrWrite, regRecord, regRowid);
  addrNe = sqlite3VdbeAddOp3(v, OP_Ne, pMWin->regOne, 0, regRowid);
  VdbeCoverageNeverNull(v);

  /* This block is run for the first row of each partition */
  s.regArg = windowInitAccum(pParse, pMWin);

  if( regStart ){
    sqlite3ExprCode(pParse, pMWin->pStart, regStart);
    windowCheckValue(pParse, regStart, 0 + (pMWin->eFrmType==TK_RANGE ? 3 : 0));
  }
  if( regEnd ){
    sqlite3ExprCode(pParse, pMWin->pEnd, regEnd);
    windowCheckValue(pParse, regEnd, 1 + (pMWin->eFrmType==TK_RANGE ? 3 : 0));
  }

  if( pMWin->eStart==pMWin->eEnd && regStart ){
    int op = ((pMWin->eStart==TK_FOLLOWING) ? OP_Ge : OP_Le);
    int addrGe = sqlite3VdbeAddOp3(v, op, regStart, 0, regEnd);
    VdbeCoverageNeverNullIf(v, op==OP_Ge); /* NeverNull because bound <expr> */
    VdbeCoverageNeverNullIf(v, op==OP_Le); /*   values previously checked */
    windowAggFinal(&s, 0);
    sqlite3VdbeAddOp2(v, OP_Rewind, s.current.csr, 1);
    VdbeCoverageNeverTaken(v);
    windowReturnOneRow(&s);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, s.current.csr);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, lblWhereEnd);
    sqlite3VdbeJumpHere(v, addrGe);
  }
  if( pMWin->eStart==TK_FOLLOWING && pMWin->eFrmType!=TK_RANGE && regEnd ){
    assert( pMWin->eEnd==TK_FOLLOWING );
    sqlite3VdbeAddOp3(v, OP_Subtract, regStart, regEnd, regStart);
  }

  if( pMWin->eStart!=TK_UNBOUNDED ){
    sqlite3VdbeAddOp2(v, OP_Rewind, s.start.csr, 1);
    VdbeCoverageNeverTaken(v);
  }
  sqlite3VdbeAddOp2(v, OP_Rewind, s.current.csr, 1);
  VdbeCoverageNeverTaken(v);
  sqlite3VdbeAddOp2(v, OP_Rewind, s.end.csr, 1);
  VdbeCoverageNeverTaken(v);
  if( regPeer && pOrderBy ){
    sqlite3VdbeAddOp3(v, OP_Copy, regNewPeer, regPeer, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.start.reg, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.current.reg, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.end.reg, pOrderBy->nExpr-1);
  }

  sqlite3VdbeAddOp2(v, OP_Goto, 0, lblWhereEnd);

  sqlite3VdbeJumpHere(v, addrNe);

  /* Beginning of the block executed for the second and subsequent rows. */
  if( regPeer ){
    windowIfNewPeer(pParse, pOrderBy, regNewPeer, regPeer, lblWhereEnd);
  }
  if( pMWin->eStart==TK_FOLLOWING ){
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eEnd!=TK_UNBOUNDED ){
      if( pMWin->eFrmType==TK_RANGE ){
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int addrNext = sqlite3VdbeCurrentAddr(v);
        windowCodeRangeTest(&s, OP_Ge, s.current.csr, regEnd, s.end.csr, lbl);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        sqlite3VdbeAddOp2(v, OP_Goto, 0, addrNext);
        sqlite3VdbeResolveLabel(v, lbl);
      }else{
        windowCodeOp(&s, WINDOW_RETURN_ROW, regEnd, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
      }
    }
  }else
  if( pMWin->eEnd==TK_PRECEDING ){
    int bRPS = (pMWin->eStart==TK_PRECEDING && pMWin->eFrmType==TK_RANGE);
    windowCodeOp(&s, WINDOW_AGGSTEP, regEnd, 0);
    if( bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
    if( !bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
  }else{
    int addr = 0;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eEnd!=TK_UNBOUNDED ){
      if( pMWin->eFrmType==TK_RANGE ){
        int lbl = 0;
        addr = sqlite3VdbeCurrentAddr(v);
        if( regEnd ){
          lbl = sqlite3VdbeMakeLabel(pParse);
          windowCodeRangeTest(&s, OP_Ge, s.current.csr, regEnd, s.end.csr, lbl);
        }
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        if( regEnd ){
          sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
          sqlite3VdbeResolveLabel(v, lbl);
        }
      }else{
        if( regEnd ){
          addr = sqlite3VdbeAddOp3(v, OP_IfPos, regEnd, 0, 1);
          VdbeCoverage(v);
        }
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        if( regEnd ) sqlite3VdbeJumpHere(v, addr);
      }
    }
  }

  /* End of the main input loop */
  sqlite3VdbeResolveLabel(v, lblWhereEnd);
  sqlite3WhereEnd(pWInfo);

  /* Fall through */
  if( pMWin->pPartition ){
    addrInteger = sqlite3VdbeAddOp2(v, OP_Integer, 0, regFlushPart);
    sqlite3VdbeJumpHere(v, addrGosubFlush);
  }

  addrEmpty = sqlite3VdbeAddOp1(v, OP_Rewind, csrWrite);
  VdbeCoverage(v);
  if( pMWin->eEnd==TK_PRECEDING ){
    int bRPS = (pMWin->eStart==TK_PRECEDING && pMWin->eFrmType==TK_RANGE);
    windowCodeOp(&s, WINDOW_AGGSTEP, regEnd, 0);
    if( bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
  }else if( pMWin->eStart==TK_FOLLOWING ){
    int addrStart;
    int addrBreak1;
    int addrBreak2;
    int addrBreak3;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eFrmType==TK_RANGE ){
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 1);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    }else
    if( pMWin->eEnd==TK_UNBOUNDED ){
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, regStart, 1);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, 0, 1);
    }else{
      assert( pMWin->eEnd==TK_FOLLOWING );
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, regEnd, 1);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 1);
    }
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak2);
    addrStart = sqlite3VdbeCurrentAddr(v);
    addrBreak3 = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak1);
    sqlite3VdbeJumpHere(v, addrBreak3);
  }else{
    int addrBreak;
    int addrStart;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    addrStart = sqlite3VdbeCurrentAddr(v);
    addrBreak = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak);
  }
  sqlite3VdbeJumpHere(v, addrEmpty);

  sqlite3VdbeAddOp1(v, OP_ResetSorter, s.current.csr);
  if( pMWin->pPartition ){
    if( pMWin->regStartRowid ){
      sqlite3VdbeAddOp2(v, OP_Integer, 1, pMWin->regStartRowid);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pMWin->regEndRowid);
    }
    sqlite3VdbeChangeP1(v, addrInteger, sqlite3VdbeCurrentAddr(v));
    sqlite3VdbeAddOp1(v, OP_Return, regFlushPart);
  }
}